

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::verifyOutputImage
          (SmokeTest *this,testCase *test_case,size_t param_2,GLint param_3,
          size_t index_of_swizzled_channel,GLubyte *data)

{
  TestError *pTVar1;
  ulong local_58;
  size_t i;
  GLuint *image;
  GLuint expected_value;
  _texture_format *source_format;
  GLubyte *data_local;
  size_t index_of_swizzled_channel_local;
  GLint param_4_local;
  size_t param_3_local;
  testCase *test_case_local;
  SmokeTest *this_local;
  
  if (*(int *)(texture_formats + test_case->m_source_texture_format_index * 0x78 + 4) != 0x8d70) {
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0xe78);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_58 = 0;
  while( true ) {
    if (0x3f < local_58) {
      return;
    }
    if (*(GLuint *)(data + local_58 * 4) != verifyOutputImage::rgba32ui[index_of_swizzled_channel])
    break;
    local_58 = local_58 + 1;
  }
  pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar1,"Found pixel with wrong value",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
             ,0xe71);
  __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SmokeTest::verifyOutputImage(const testCase& test_case, size_t /* output_format_index */,
								  glw::GLint /* output_channel_size */, size_t index_of_swizzled_channel,
								  const glw::GLubyte* data)
{
	static const glw::GLuint rgba32ui[6] = { 0x3fffffff, 0x7fffffff, 0xbfffffff, 0xffffffff, 1, 0 };

	const _texture_format& source_format = texture_formats[test_case.m_source_texture_format_index];

	/* Set color */
	switch (source_format.m_internal_format)
	{
	case GL_RGBA32UI:
	{
		glw::GLuint		   expected_value = rgba32ui[index_of_swizzled_channel];
		const glw::GLuint* image		  = (glw::GLuint*)data;

		for (size_t i = 0; i < m_output_width * m_output_height; ++i)
		{
			if (image[i] != expected_value)
			{
				TCU_FAIL("Found pixel with wrong value");
			}
		}
	}
	break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}